

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O3

bool __thiscall CInput::CJoystick::Relative(CJoystick *this,float *pX,float *pY)

{
  CConfig *pCVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  float fVar3;
  
  pCVar1 = this->m_pInput->m_pConfig;
  if (pCVar1->m_JoystickEnable != 0) {
    (*(this->super_IJoystick)._vptr_IJoystick[6])(this,(ulong)(uint)pCVar1->m_JoystickX);
    (*(this->super_IJoystick)._vptr_IJoystick[6])
              (this,(ulong)(uint)this->m_pInput->m_pConfig->m_JoystickY);
    fVar2 = SQRT(extraout_XMM0_Da * extraout_XMM0_Da + extraout_XMM0_Da_00 * extraout_XMM0_Da_00);
    fVar3 = (float)this->m_pInput->m_pConfig->m_JoystickTolerance / 50.0;
    if (fVar3 < fVar2) {
      fVar3 = (fVar2 - fVar3) / (1.0 - fVar3);
      if (fVar3 <= 0.001) {
        fVar3 = 0.001;
      }
      fVar2 = (fVar3 * 0.1) / fVar2;
      *pX = extraout_XMM0_Da * fVar2;
      *pY = extraout_XMM0_Da_00 * fVar2;
      return true;
    }
  }
  return false;
}

Assistant:

CInput *Input() { return m_pInput; }